

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O0

void __thiscall cashew::JSPrinter::printDot(JSPrinter *this,Ref node)

{
  Ref *pRVar1;
  Value *this_00;
  char *s;
  JSPrinter *this_local;
  Ref node_local;
  
  this_local = (JSPrinter *)node.inst;
  pRVar1 = Ref::operator[]((Ref *)&this_local,1);
  print(this,pRVar1->inst);
  emit(this,'.');
  pRVar1 = Ref::operator[]((Ref *)&this_local,2);
  this_00 = Ref::operator->(pRVar1);
  s = cashew::Value::getCString(this_00);
  emit(this,s);
  return;
}

Assistant:

void printDot(Ref node) {
    print(node[1]);
    emit('.');
    emit(node[2]->getCString());
  }